

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall CheaterBotStrategy::cheaterAttack(CheaterBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  Country *toExchange;
  pointer ppPVar3;
  pointer pcVar4;
  bool bVar5;
  GameLoop *pGVar6;
  pointer ppPVar7;
  ostream *poVar8;
  PlayerState *pPVar9;
  pointer ppCVar10;
  pointer ppCVar11;
  Player *pPVar12;
  bool bVar13;
  bool bVar14;
  long *local_60;
  long local_58;
  long local_50 [2];
  pointer local_40;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "We have a cheater! They are conquering all their neighbouring countries",0x47);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar10 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  bVar13 = ppCVar10 == local_40;
  do {
    if (bVar13) {
LAB_0011d1bf:
      pPVar12 = (this->super_PlayerStrategy).player;
      pPVar9 = pPVar12->currentState;
      if (pPVar9 != (PlayerState *)0x0) {
        operator_delete(pPVar9,4);
      }
      pPVar9 = (PlayerState *)operator_new(4);
      *pPVar9 = IDLE;
      pPVar12->currentState = pPVar9;
      (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
      return 1;
    }
    ppCVar2 = ((*ppCVar10)->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_38 = ppCVar10;
    for (ppCVar11 = ((*ppCVar10)->pAdjCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_start; bVar14 = ppCVar11 != ppCVar2, bVar14;
        ppCVar11 = ppCVar11 + 1) {
      toExchange = *ppCVar11;
      if (*toExchange->pPlayerOwnerId != *((this->super_PlayerStrategy).player)->pPlayerId) {
        pGVar6 = GameLoop::getInstance();
        ppPVar7 = (pGVar6->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppPVar3 = (pGVar6->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppPVar7 == ppPVar3) {
          pPVar12 = (Player *)0x0;
        }
        else {
          pPVar12 = (Player *)0x0;
          do {
            if (*(*ppPVar7)->pPlayerId == *toExchange->pPlayerOwnerId) {
              pPVar12 = *ppPVar7;
            }
            ppPVar7 = ppPVar7 + 1;
          } while (ppPVar7 != ppPVar3);
        }
        if ((pPVar12 == (Player *)0x0) ||
           (bVar5 = exchangeCountryOwnership(this,pPVar12,toExchange), !bVar5)) {
          pPVar12 = (this->super_PlayerStrategy).player;
          pPVar9 = pPVar12->currentState;
          if (pPVar9 != (PlayerState *)0x0) {
            operator_delete(pPVar9,4);
          }
          pPVar9 = (PlayerState *)operator_new(4);
          *pPVar9 = IDLE;
          pPVar12->currentState = pPVar9;
          (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
          if (bVar14) {
            if (!bVar13) {
              return -1;
            }
            goto LAB_0011d1bf;
          }
          break;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[CHEATER] - Country ",0x14);
        pcVar4 = (toExchange->cyName->_M_dataplus)._M_p;
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar4,pcVar4 + toExchange->cyName->_M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_60,local_58);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," has been attacked & conquered by Player ",0x29);
        poVar8 = (ostream *)
                 std::ostream::operator<<(poVar8,*((this->super_PlayerStrategy).player)->pPlayerId);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," -\n",3);
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
      }
    }
    ppCVar10 = local_38 + 1;
    bVar13 = ppCVar10 == local_40;
  } while( true );
}

Assistant:

int CheaterBotStrategy::cheaterAttack() {
    std::cout << "We have a cheater! They are conquering all their neighbouring countries" << std::endl;
    for (auto* country : *this->player->getOwnedCountries()) {
        for (auto* neighbour : *country->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() == this->player->getPlayerId()) {
                continue;
            }
            Player* defendingPlayer = nullptr;
            for (auto* i : *GameLoop::getInstance()->getAllPlayers()) {
                if (i->getPlayerId() == neighbour->getPlayerOwnerID()) {
                    defendingPlayer = i;
                }
            }
            if (defendingPlayer == nullptr) {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
            if (exchangeCountryOwnership(defendingPlayer, neighbour)) {
                std::cout << "[CHEATER] - Country " << neighbour->getCountryName() << " has been attacked & conquered by Player " << this->player->getPlayerId() << " -\n";
                continue;
            } else {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
        }
    }
    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}